

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

string * __thiscall
AssemblyCode::JumpCommand::ToString_abi_cxx11_(string *__return_storage_ptr__,JumpCommand *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"jmp ",&(this->super_AbstractJumpCommand).label);
  std::operator+(__return_storage_ptr__,&local_30,"\n");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblyCode::JumpCommand::ToString( ) const {
    return "jmp " + label + "\n";
}